

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

ebml_element *
EBML_FindNextElement
          (stream *Input,ebml_parser_context *pContext,int *UpperLevels,bool_t AllowDummyElt)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  filepos_t fVar4;
  long lVar5;
  bool_t bVar6;
  long lVar7;
  ebml_element *peVar8;
  filepos_t local_f0;
  filepos_t local_e8;
  ebml_element *Result_1;
  ebml_element *peStack_c8;
  int LevelChange_1;
  ebml_element *Result;
  int LevelChange;
  uint8_t IdBitMask;
  size_t _SizeLength;
  ebml_parser_context *Context;
  ebml_parser_context OrigContext;
  filepos_t StartPos;
  filepos_t CurrentPos;
  int UpperLevel_original;
  bool_t bFound;
  filepos_t SizeFound;
  uint32_t ReadSize;
  int8_t ReadIndex;
  int8_t SizeIdx;
  filepos_t SizeUnknown;
  byte local_48 [4];
  int PossibleSizeLength;
  uint8_t PossibleIdNSize [16];
  uint8_t PossibleID_Length;
  bool_t AllowDummyElt_local;
  int *UpperLevels_local;
  ebml_parser_context *pContext_local;
  stream *Input_local;
  
  PossibleIdNSize[0xf] = '\0';
  SizeFound._6_1_ = '\0';
  SizeFound._0_4_ = 0;
  iVar1 = *UpperLevels;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x1e2,
                  "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                 );
  }
  OrigContext._24_8_ = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
  _SizeLength = (size_t)&Context;
  if (OrigContext._24_8_ == -1) {
    return (ebml_element *)0x0;
  }
  if ((ebml_parser_context **)_SizeLength == (ebml_parser_context **)0x0) {
    __assert_fail("Context != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x1e9,
                  "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                 );
  }
  Context = (ebml_parser_context *)pContext->Context;
  OrigContext.Context = (ebml_context *)pContext->UpContext;
  OrigContext.UpContext = (ebml_parser_context *)pContext->EndPosition;
  OrigContext.EndPosition = *(filepos_t *)&pContext->Profile;
  while( true ) {
    bVar2 = false;
    if ((_SizeLength != 0) && (bVar2 = false, *(long *)(_SizeLength + 0x10) != -1)) {
      bVar2 = *(long *)(_SizeLength + 0x10) <= (long)OrigContext._24_8_;
    }
    if ((!bVar2) || (*(long *)(_SizeLength + 8) == 0)) break;
    _SizeLength = *(size_t *)(_SizeLength + 8);
    *UpperLevels = *UpperLevels + 1;
  }
LAB_00104ce5:
  do {
    Result._7_1_ = 0x80;
    if ('\x0f' < SizeFound._6_1_) {
      __assert_fail("ReadIndex < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x1fc,
                    "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                   );
    }
    bVar2 = false;
    for (SizeFound._7_1_ = 0;
        (char)SizeFound._7_1_ < SizeFound._6_1_ && (char)SizeFound._7_1_ < '\x04';
        SizeFound._7_1_ = SizeFound._7_1_ + 1) {
      if (((uint)local_48[0] & 0x80 >> (SizeFound._7_1_ & 0x1f)) != 0) {
        PossibleIdNSize[0xf] = SizeFound._7_1_ + 1;
        Result._7_1_ = (undefined1)(0x80 >> (SizeFound._7_1_ & 0x1f));
        bVar2 = true;
        break;
      }
    }
    if ((!bVar2) && (*(long *)(_SizeLength + 0x10) != OrigContext._24_8_ + (ulong)(uint)SizeFound))
    {
      if ('\x03' < SizeFound._6_1_) {
        SizeFound._6_1_ = SizeFound._6_1_ + -1;
        memmove(local_48,local_48 + 1,(long)SizeFound._6_1_);
      }
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x213,
                      "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                     );
      }
      lVar5 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,local_48 + SizeFound._6_1_,1,0);
      if (lVar5 != 0) {
        return (ebml_element *)0x0;
      }
      SizeFound._0_4_ = (uint)SizeFound + 1;
      SizeFound._6_1_ = SizeFound._6_1_ + '\x01';
      goto LAB_00104ce5;
    }
    SizeFound._7_1_ = SizeFound._6_1_;
    SizeUnknown._4_4_ = (int)(char)(SizeFound._6_1_ - PossibleIdNSize[0xf]);
    bVar2 = false;
    while( true ) {
      _LevelChange = (ulong)SizeUnknown._4_4_;
      fVar4 = EBML_ReadCodedSizeValue
                        (local_48 + PossibleIdNSize[0xf],(size_t *)&LevelChange,
                         (filepos_t *)&ReadSize);
      if (_LevelChange != 0) break;
      if ((7 < SizeUnknown._4_4_) ||
         (((0 < SizeUnknown._4_4_ && (local_48[PossibleIdNSize[0xf]] == 0)) ||
          (*(long *)(_SizeLength + 0x10) == OrigContext._24_8_ + (ulong)(uint)SizeFound))))
      goto LAB_00104f9c;
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x22d,
                      "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                     );
      }
      lVar5 = (**(code **)((long)(Input->Base).VMT + 0x60))
                        (Input,local_48 + (char)SizeFound._7_1_,1,0);
      if (lVar5 != 0) {
        return (ebml_element *)0x0;
      }
      SizeFound._0_4_ = (uint)SizeFound + 1;
      SizeUnknown._4_4_ = SizeUnknown._4_4_ + 1;
      SizeFound._7_1_ = SizeFound._7_1_ + '\x01';
    }
    bVar2 = true;
LAB_00104f9c:
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x233,
                    "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                   );
    }
    lVar5 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    if ((bVar2) && (fVar4 != _ReadSize)) {
      while( true ) {
        bVar3 = false;
        if ((_SizeLength != 0) && (bVar3 = false, *(long *)(_SizeLength + 0x10) != -1)) {
          bVar3 = *(long *)(_SizeLength + 0x10) < (lVar5 + fVar4) - (long)(char)SizeFound._7_1_;
        }
        if (!bVar3) goto LAB_0010509b;
        if ((AllowDummyElt != 0) || (*(long *)(_SizeLength + 8) == 0)) break;
        _SizeLength = *(size_t *)(_SizeLength + 8);
        *UpperLevels = *UpperLevels + 1;
      }
      bVar2 = false;
    }
LAB_0010509b:
    if (bVar2) {
      Result._0_4_ = 0;
      peStack_c8 = EBML_ElementCreateUsingContext
                             (Input,local_48,PossibleIdNSize[0xf],(ebml_parser_context *)_SizeLength
                              ,(int *)&Result,0,AllowDummyElt);
      if (peStack_c8 != (ebml_element *)0x0) {
        if ((AllowDummyElt != 0) || (bVar6 = EBML_ElementIsDummy(peStack_c8), bVar6 == 0)) {
          if (8 < _LevelChange) {
            __assert_fail("_SizeLength <= 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                          ,0x24e,
                          "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                         );
          }
          peStack_c8->SizeLength = (int8_t)_LevelChange;
          peStack_c8->DataSize = fVar4;
          if (fVar4 == _ReadSize) {
            local_e8 = *(filepos_t *)(_SizeLength + 0x10);
          }
          else {
            local_e8 = (lVar5 - (char)SizeFound._7_1_) + (ulong)PossibleIdNSize[0xf] + _LevelChange
                       + fVar4;
          }
          peStack_c8->EndPosition = local_e8;
          EBML_ElementSetInfiniteSize(peStack_c8,(long)(int)(uint)(fVar4 == _ReadSize));
          if (AllowDummyElt != 0) {
            if (peStack_c8 == (ebml_element *)0x0) {
              __assert_fail("(const void*)(Result)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                            ,0x254,
                            "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                           );
            }
            lVar7 = (**(code **)((long)(peStack_c8->Base).Base.VMT + 0x70))(peStack_c8);
            if ((lVar7 == 0) && (bVar6 = EBML_ElementIsDummy(peStack_c8), bVar6 == 0)) {
              NodeDelete((node *)peStack_c8);
              peStack_c8 = CreateElement(Input,local_48,PossibleIdNSize[0xf],&EBML_ContextDummy,
                                         (ebml_master *)0x0,-1);
              peStack_c8->SizeLength = (int8_t)_LevelChange;
              peStack_c8->DataSize = fVar4;
              if (fVar4 == _ReadSize) {
                local_f0 = *(filepos_t *)(_SizeLength + 0x10);
              }
              else {
                local_f0 = (lVar5 - (char)SizeFound._7_1_) + (ulong)PossibleIdNSize[0xf] +
                           _LevelChange + fVar4;
              }
              peStack_c8->EndPosition = local_f0;
              EBML_ElementSetInfiniteSize(peStack_c8,(long)(int)(uint)(fVar4 == _ReadSize));
            }
          }
          if (peStack_c8 == (ebml_element *)0x0) {
            __assert_fail("(const void*)(Result)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                          ,0x264,
                          "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                         );
          }
          lVar7 = (**(code **)((long)(peStack_c8->Base).Base.VMT + 0x70))(peStack_c8);
          if (lVar7 != 0) {
            if (fVar4 == _ReadSize) {
              peStack_c8->DataSize = -1;
            }
            if (0 < (int)Result) {
              *UpperLevels = (int)Result + *UpperLevels;
            }
            peStack_c8->SizePosition = (lVar5 - (char)SizeFound._7_1_) + (ulong)PossibleIdNSize[0xf]
            ;
            peStack_c8->ElementPosition = peStack_c8->SizePosition - (ulong)PossibleIdNSize[0xf];
            if (Input == (stream *)0x0) {
              __assert_fail("(const void*)(Input)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                            ,0x270,
                            "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                           );
            }
            (**(code **)((long)(Input->Base).VMT + 0x78))
                      (Input,peStack_c8->SizePosition + _LevelChange,0);
            return peStack_c8;
          }
        }
        NodeDelete((node *)peStack_c8);
      }
    }
    if ((*(long *)(_SizeLength + 0x10) != -1) && (*(long *)(_SizeLength + 0x10) <= lVar5)) {
      if (AllowDummyElt == 0) {
        return (ebml_element *)0x0;
      }
      if (*(long *)(_SizeLength + 0x10) == lVar5) {
        return (ebml_element *)0x0;
      }
      peVar8 = CreateElement(Input,local_48,PossibleIdNSize[0xf],&EBML_ContextDummy,
                             (ebml_master *)0x0,-1);
      if (peVar8 == (ebml_element *)0x0) {
        return (ebml_element *)0x0;
      }
      peVar8->SizePosition = (lVar5 - (char)SizeFound._7_1_) + (ulong)PossibleIdNSize[0xf];
      peVar8->ElementPosition = peVar8->SizePosition - (ulong)PossibleIdNSize[0xf];
      peVar8->DataSize = 0;
      peVar8->SizeLength = (char)*(undefined8 *)(_SizeLength + 0x10) - (char)peVar8->SizePosition;
      peVar8->EndPosition = *(filepos_t *)(_SizeLength + 0x10);
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x289,
                      "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                     );
      }
      (**(code **)((long)(Input->Base).VMT + 0x78))(Input,*(undefined8 *)(_SizeLength + 0x10),0);
      return peVar8;
    }
    SizeFound._6_1_ = SizeFound._7_1_ + -1;
    memmove(local_48,local_48 + 1,(long)SizeFound._6_1_);
    *UpperLevels = iVar1;
    Context = (ebml_parser_context *)pContext->Context;
    OrigContext.Context = (ebml_context *)pContext->UpContext;
    OrigContext.UpContext = (ebml_parser_context *)pContext->EndPosition;
    OrigContext.EndPosition = *(filepos_t *)&pContext->Profile;
    _SizeLength = (size_t)&Context;
    bVar2 = true;
    if (OrigContext.UpContext != (ebml_parser_context *)0xffffffffffffffff) {
      bVar2 = (long)((lVar5 - (char)SizeFound._7_1_) + (ulong)PossibleIdNSize[0xf]) <
              (long)OrigContext.UpContext;
    }
    if (!bVar2) {
      return (ebml_element *)0x0;
    }
  } while( true );
}

Assistant:

ebml_element *EBML_FindNextElement(struct stream *Input, const ebml_parser_context *pContext, int *UpperLevels, bool_t AllowDummyElt)
{
    uint8_t PossibleID_Length = 0;
    uint8_t PossibleIdNSize[16];
    int PossibleSizeLength;
    filepos_t SizeUnknown;
    int8_t SizeIdx,ReadIndex = 0; // trick for the algo, start index at 0
    uint32_t ReadSize = 0;
    filepos_t SizeFound;
    bool_t bFound;
    int UpperLevel_original = *UpperLevels;
    filepos_t CurrentPos;
    filepos_t StartPos = Stream_Seek(Input,0,SEEK_CUR);
    ebml_parser_context OrigContext;
    const ebml_parser_context *Context = &OrigContext;

    if (StartPos == INVALID_FILEPOS_T)
        return NULL;

    assert(Context != NULL);
    OrigContext = *pContext;

    // adjust the Context to allow the StartPos to make sense
    while (Context && Context->EndPosition != INVALID_FILEPOS_T && (StartPos >= Context->EndPosition))
    {
        if (Context->UpContext==NULL)
            break;
        Context = Context->UpContext;
        (*UpperLevels)++;
    }

    do {
        size_t _SizeLength;

        // read a potential ID
        do {
            uint8_t IdBitMask = 1 << 7;

            assert(ReadIndex < 16);
            // build the ID with the current Read Buffer
            bFound = 0;
            for (SizeIdx = 0; SizeIdx < ReadIndex && SizeIdx < 4; SizeIdx++) {
                if (PossibleIdNSize[0] & (IdBitMask >> SizeIdx)) {
                    // ID found
                    PossibleID_Length = SizeIdx + 1;
                    IdBitMask >>= SizeIdx;
                    bFound = 1;
                    break;
                }
            }
            if (bFound)
                break;
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit

            if (ReadIndex >= 4) {
                // ID not found
                // shift left the read octets
                memmove(&PossibleIdNSize[0],&PossibleIdNSize[1], --ReadIndex);
            }

            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[ReadIndex++], 1, NULL)!=ERR_NONE)
                return NULL; // no more data ?
            ReadSize++;

        } while (!bFound);

        SizeIdx = ReadIndex;
        ReadIndex = ReadIndex - PossibleID_Length;

        // read the data size
        PossibleSizeLength = ReadIndex;
        bFound = 0;
        while (1)
        {
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleIdNSize[PossibleID_Length], &_SizeLength, &SizeUnknown);
            if (_SizeLength != 0) {
                bFound = 1;
                break;
            }
            if (PossibleSizeLength >= 8)
                break;
            if (PossibleSizeLength > 0 && PossibleIdNSize[PossibleID_Length] == 0)
                break; // invalid all zero size
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit
            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[SizeIdx++], 1, NULL)!=ERR_NONE)
                return NULL;
            ReadSize++;
            PossibleSizeLength++;
        }

        CurrentPos = Stream_Seek(Input,0,SEEK_CUR);
        if (bFound)
        {
            // make sure the element we found is contained in the Context
            if (SizeFound != SizeUnknown)
            {
                while (Context && Context->EndPosition != INVALID_FILEPOS_T && (CurrentPos + SizeFound - SizeIdx > Context->EndPosition))
                {
                    if (AllowDummyElt || Context->UpContext==NULL)
                    {
                        bFound = 0;
                        break;
                    }
                    Context = Context->UpContext;
                    (*UpperLevels)++;
                }
            }
        }

        if (bFound)
        {
            // find the element in the context and use the correct creator
            int LevelChange = 0;
            ebml_element *Result = EBML_ElementCreateUsingContext(Input, PossibleIdNSize, PossibleID_Length, Context, &LevelChange, 0, AllowDummyElt);
            if (Result != NULL)
            {
                if (AllowDummyElt || !EBML_ElementIsDummy(Result)) {
                    assert(_SizeLength <= 8);
                    Result->SizeLength = (int8_t)_SizeLength;
                    Result->DataSize = SizeFound;
                    Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                    EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);

                    if (AllowDummyElt && !EBML_ElementValidateSize(Result) && !EBML_ElementIsDummy(Result))
                    {
                        // the element has a good ID but wrong size, so replace with a dummy
                        NodeDelete((node*)Result);
                        Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                        Result->SizeLength = (int8_t)_SizeLength;
                        Result->DataSize = SizeFound;
                        Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                        EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);
                    }

                    // LevelChange values
                    // -1 : global element
                    //  0 : child
                    //  1 : same level
                    //  + : further parent
                    if (EBML_ElementValidateSize(Result))
                    {
                        if (SizeFound == SizeUnknown)
                        {
                            Result->DataSize = INVALID_FILEPOS_T;
                        }

                        if (LevelChange > 0)
                            *UpperLevels += LevelChange;
                        Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                        Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                        // place the file at the beggining of the data
                        Stream_Seek(Input,Result->SizePosition + _SizeLength,SEEK_SET);
                        return Result;
                    }
                }
                NodeDelete((node*)Result);
            }
        }

        if (Context->EndPosition!=INVALID_FILEPOS_T && Context->EndPosition <= CurrentPos)
        {
            if (AllowDummyElt && Context->EndPosition != CurrentPos)
            {
                /* add a dummy placeholder for the remaining of the parent */
                int LevelChange = 0;
                ebml_element *Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                if (Result != NULL)
                {
                    if (LevelChange > 0)
                        *UpperLevels += LevelChange;
                    Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                    Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                    Result->DataSize = 0;
                    Result->SizeLength = (int8_t)(Context->EndPosition - Result->SizePosition);
                    Result->EndPosition = Context->EndPosition;
                    // place the file at the end of the element
                    Stream_Seek(Input,Context->EndPosition,SEEK_SET);
                    return Result;
                }
            }
            break; // we should not read further than our limit
        }

        // recover all the data in the buffer minus one byte
        ReadIndex = SizeIdx - 1;
        memmove(&PossibleIdNSize[0], &PossibleIdNSize[1], ReadIndex);
        *UpperLevels = UpperLevel_original;
        OrigContext = *pContext;
        Context = &OrigContext;
    } while (Context->EndPosition==INVALID_FILEPOS_T || (Context->EndPosition > CurrentPos - SizeIdx + PossibleID_Length));

    return NULL;
}